

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_devices
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  anon_union_24_2_293c120a_for_Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>_1
  local_30;
  byte local_18;
  
  select_impl((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
              &local_30.m_value,this);
  if (local_18 == 0) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = local_30.m_error.type._M_value;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_30.m_value.
         super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    if (local_30.m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pointer)CONCAT44(local_30._4_4_,local_30.m_error.type._M_value)) {
      std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::vector
                ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                 __return_storage_ptr__,&local_30.m_value);
      __return_storage_ptr__->m_init = true;
      goto LAB_00133067;
    }
    (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
  }
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  __return_storage_ptr__->m_init = false;
LAB_00133067:
  if ((local_18 & 1) != 0) {
    std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
              (&local_30.m_value);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_devices() const {
    auto const selected_devices = select_impl();
    if (!selected_devices) return Result<std::vector<PhysicalDevice>>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_suitable_device };
    }
    return selected_devices.value();
}